

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

bool density_tests::detail::
     PutTestObject<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>,_2048UL,_2048UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  ulong uVar1;
  double dVar2;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  type;
  ElementType source;
  
  uVar1 = (ulong)&stack0xffffffffffffffe8 & 0xfffffffffffff800;
  *(undefined8 *)(uVar1 - 0x1808) = 0xc1d7da;
  dVar2 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&i_rand->m_rand);
  if (dVar2 < 0.9) {
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d855;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d860;
    density::
    conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
    ::emplace<density_tests::TestObject<2048ul,2048ul>,density_tests::TestObject<2048ul,2048ul>>
              ((conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
                *)queue,(TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d86d;
    TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
  }
  else {
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d7f5;
    InstanceCounted::new_instance((InstanceCounted *)(uVar1 - 0x1008));
    *(undefined1 **)(uVar1 - 0x1008) =
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<2048ul,2048ul>>
         ::s_table;
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d811;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d829;
    density::
    conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
    ::dyn_push_copy((conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
                     *)queue,(runtime_type *)(uVar1 - 0x1008),(void *)(uVar1 - 0x1000));
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d836;
    TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
    *(undefined8 *)(uVar1 - 0x1808) = 0xc1d843;
    InstanceCounted::~InstanceCounted((InstanceCounted *)(uVar1 - 0x1008));
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }